

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void wallet::wallet_tests::LoadReceiveRequests_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  LoadReceiveRequests t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1a8;
  std_string *in_stack_fffffffffffff1b0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1b8;
  LoadReceiveRequests *in_stack_fffffffffffff1c8;
  const_string *in_stack_fffffffffffff1d0;
  const_string *msg;
  size_t in_stack_fffffffffffff1d8;
  size_t line_num;
  const_string *in_stack_fffffffffffff1e0;
  unit_test_log_t *in_stack_fffffffffffff1e8;
  LoadReceiveRequests *in_stack_fffffffffffff208;
  const_string local_c88 [25];
  undefined1 local_af0 [408];
  undefined1 local_958 [408];
  undefined1 local_7c0 [1568];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [20])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [15])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  LoadReceiveRequests::LoadReceiveRequests(in_stack_fffffffffffff1c8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_7c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [20])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [16])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::unit_test::setup_conditional<wallet::wallet_tests::LoadReceiveRequests>
            ((LoadReceiveRequests *)0xe2eff0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_958,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [20])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  LoadReceiveRequests::test_method(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_af0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [20])in_stack_fffffffffffff1b0);
  this = boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [19])in_stack_fffffffffffff1b0);
  file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::unit_test::teardown_conditional<wallet::wallet_tests::LoadReceiveRequests>
            ((LoadReceiveRequests *)0xe2f216);
  line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  msg = local_c88;
  memset(msg,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [20])in_stack_fffffffffffff1b0);
  this_00 = boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [15])in_stack_fffffffffffff1b0);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,line_num,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  LoadReceiveRequests::~LoadReceiveRequests((LoadReceiveRequests *)in_stack_fffffffffffff1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(LoadReceiveRequests, TestingSetup)
{
    for (DatabaseFormat format : DATABASE_FORMATS) {
        const std::string name{strprintf("receive-requests-%i", format)};
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(PKHash()));
            WalletBatch batch{wallet->GetDatabase()};
            BOOST_CHECK(batch.WriteAddressPreviouslySpent(PKHash(), true));
            BOOST_CHECK(batch.WriteAddressPreviouslySpent(ScriptHash(), true));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "0", "val_rr00"));
            BOOST_CHECK(wallet->EraseAddressReceiveRequest(batch, PKHash(), "0"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "1", "val_rr10"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "1", "val_rr11"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, ScriptHash(), "2", "val_rr20"));
        });
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(wallet->IsAddressPreviouslySpent(PKHash()));
            BOOST_CHECK(wallet->IsAddressPreviouslySpent(ScriptHash()));
            auto requests = wallet->GetAddressReceiveRequests();
            auto erequests = {"val_rr11", "val_rr20"};
            BOOST_CHECK_EQUAL_COLLECTIONS(requests.begin(), requests.end(), std::begin(erequests), std::end(erequests));
            RunWithinTxn(wallet->GetDatabase(), /*process_desc*/"test", [](WalletBatch& batch){
                BOOST_CHECK(batch.WriteAddressPreviouslySpent(PKHash(), false));
                BOOST_CHECK(batch.EraseAddressData(ScriptHash()));
                return true;
            });
        });
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(PKHash()));
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(ScriptHash()));
            auto requests = wallet->GetAddressReceiveRequests();
            auto erequests = {"val_rr11"};
            BOOST_CHECK_EQUAL_COLLECTIONS(requests.begin(), requests.end(), std::begin(erequests), std::end(erequests));
        });
    }
}